

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O1

void cuddPrintVarGroups(DdManager *dd,MtrNode *root,int zdd,int silent)

{
  uint uVar1;
  MtrNode *root_00;
  
  if (root == (MtrNode *)0x0) {
    __assert_fail("root != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                  ,0x2f4,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
  }
  if ((root->younger != (MtrNode *)0x0) && (root->younger->elder != root)) {
    __assert_fail("root->younger == NULL || root->younger->elder == root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                  ,0x2f5,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
  }
  if ((root->elder != (MtrNode *)0x0) && (root->elder->younger != root)) {
    __assert_fail("root->elder == NULL || root->elder->younger == root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                  ,0x2f6,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
  }
  uVar1 = (&dd->perm)[zdd != 0][root->index];
  if (silent == 0) {
    printf("(%d",(ulong)uVar1);
  }
  if (((root->flags & 1) == 0) && (root_00 = root->child, root_00 != (MtrNode *)0x0)) {
    do {
      if ((root_00->low < root->low) ||
         ((int)(root->low + root->size) < (int)(root_00->low + root_00->size))) {
        __assert_fail("node->low >= root->low && (int) (node->low + node->size) <= (int) (root->low + root->size)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                      ,0x302,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
      }
      if (root_00->parent != root) {
        __assert_fail("node->parent == root",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                      ,0x303,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
      }
      cuddPrintVarGroups(dd,root_00,zdd,silent);
      root_00 = root_00->younger;
    } while (root_00 != (MtrNode *)0x0);
  }
  else {
    if (silent != 0) goto LAB_0091007b;
    putchar(0x2c);
  }
  if (silent == 0) {
    printf("%d",(ulong)((uVar1 + root->size) - 1));
    if (root->flags != 0) {
      putchar(0x7c);
      if ((root->flags & 4) != 0) {
        putchar(0x46);
      }
      if ((root->flags & 8) != 0) {
        putchar(0x4e);
      }
      if ((root->flags & 2) != 0) {
        putchar(0x53);
      }
    }
    putchar(0x29);
    if (root->parent == (MtrNode *)0x0) {
      putchar(10);
    }
  }
LAB_0091007b:
  if (0xf < root->flags) {
    __assert_fail("(root->flags &~(MTR_TERMINAL | MTR_SOFT | MTR_FIXED | MTR_NEWNODE)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                  ,0x313,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
  }
  return;
}

Assistant:

void
cuddPrintVarGroups(
  DdManager * dd /* manager */,
  MtrNode * root /* root of the group tree */,
  int zdd /* 0: BDD; 1: ZDD */,
  int silent /* flag to check tree syntax only */)
{
    MtrNode *node;
    int level;

    assert(root != NULL);
    assert(root->younger == NULL || root->younger->elder == root);
    assert(root->elder == NULL || root->elder->younger == root);
    if (zdd) {
        level = dd->permZ[root->index];
    } else {
        level = dd->perm[root->index];
    }
    if (!silent) (void) printf("(%d",level);
    if (MTR_TEST(root,MTR_TERMINAL) || root->child == NULL) {
        if (!silent) (void) printf(",");
    } else {
        node = root->child;
        while (node != NULL) {
            assert(node->low >= root->low && (int) (node->low + node->size) <= (int) (root->low + root->size));
            assert(node->parent == root);
            cuddPrintVarGroups(dd,node,zdd,silent);
            node = node->younger;
        }
    }
    if (!silent) {
        (void) printf("%d", (int) (level + root->size - 1));
        if (root->flags != MTR_DEFAULT) {
            (void) printf("|");
            if (MTR_TEST(root,MTR_FIXED)) (void) printf("F");
            if (MTR_TEST(root,MTR_NEWNODE)) (void) printf("N");
            if (MTR_TEST(root,MTR_SOFT)) (void) printf("S");
        }
        (void) printf(")");
        if (root->parent == NULL) (void) printf("\n");
    }
    assert((root->flags &~(MTR_TERMINAL | MTR_SOFT | MTR_FIXED | MTR_NEWNODE)) == 0);
    return;

}